

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void duckdb::TemplatedWritePlain<unsigned_int,unsigned_int,duckdb::ParquetCastOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  uint uVar1;
  data_ptr_t pdVar2;
  long lVar3;
  idx_t iVar4;
  
  pdVar2 = col->data;
  for (iVar4 = chunk_start; iVar4 < chunk_end; iVar4 = iVar4 + 1) {
    uVar1 = *(uint *)(pdVar2 + iVar4 * 4);
    ser = (WriteStream *)(ulong)uVar1;
    if (uVar1 < *(uint *)&stats[1]._vptr_ColumnWriterStatistics) {
      *(uint *)&stats[1]._vptr_ColumnWriterStatistics = uVar1;
    }
    if (*(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < uVar1) {
      *(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = uVar1;
    }
  }
  lVar3 = (chunk_end - chunk_start) * 4;
  (*(code *)*(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)
            (mask,pdVar2 + chunk_start * 4,lVar3,lVar3,mask,ser);
  return;
}

Assistant:

static inline data_ptr_t GetData(Vector &vector) {
		D_ASSERT(vector.GetVectorType() == VectorType::CONSTANT_VECTOR ||
		         vector.GetVectorType() == VectorType::FLAT_VECTOR);
		return vector.data;
	}